

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

uintmax_t ghc::filesystem::remove_all(path *p,error_code *ec)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uintmax_t uVar4;
  filesystem *this;
  error_code *in_RSI;
  filesystem *in_RDI;
  error_code eVar5;
  bool is_symlink_result;
  directory_iterator iter;
  file_status fs;
  error_code tec;
  uintmax_t count;
  error_code *in_stack_ffffffffffffff18;
  directory_entry *in_stack_ffffffffffffff20;
  directory_entry *in_stack_ffffffffffffff28;
  error_code *in_stack_ffffffffffffff30;
  path *in_stack_ffffffffffffff38;
  path *in_stack_ffffffffffffff40;
  bool local_b2;
  filesystem *this_00;
  int local_a4;
  file_status local_78;
  file_status local_70;
  file_status local_68 [3];
  undefined4 uStack_4c;
  error_code *ec_00;
  error_code *local_8;
  
  std::error_code::clear((error_code *)in_stack_ffffffffffffff20);
  ec_00 = (error_code *)0x0;
  this_00 = in_RDI;
  path::path<char[2],ghc::filesystem::path>
            (in_stack_ffffffffffffff40,(char (*) [2])in_stack_ffffffffffffff38,
             (format)((ulong)in_stack_ffffffffffffff30 >> 0x20));
  bVar1 = operator==(&in_stack_ffffffffffffff20->_path,(path *)in_stack_ffffffffffffff18);
  path::~path((path *)0x1dbf5b);
  if (bVar1) {
    eVar5 = detail::make_error_code((portable_error)((ulong)in_stack_ffffffffffffff20 >> 0x20));
    *(ulong *)in_RSI = CONCAT44(uStack_4c,eVar5._M_value);
    in_RSI->_M_cat = eVar5._M_cat;
    return 0xffffffffffffffff;
  }
  std::error_code::error_code((error_code *)in_stack_ffffffffffffff20);
  symlink_status(&in_stack_ffffffffffffff28->_path,(error_code *)in_stack_ffffffffffffff20);
  file_status::file_status(&local_70,local_68);
  bVar1 = exists((file_status *)in_stack_ffffffffffffff30);
  local_b2 = false;
  if (bVar1) {
    file_status::file_status(&local_78,local_68);
    local_b2 = is_directory((file_status *)0x1dc029);
    file_status::~file_status(&local_78);
  }
  file_status::~file_status(&local_70);
  if (local_b2 != false) {
    directory_iterator::directory_iterator
              ((directory_iterator *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               in_stack_ffffffffffffff30);
    while( true ) {
      directory_iterator::directory_iterator((directory_iterator *)this_00);
      bVar1 = directory_iterator::operator!=
                        ((directory_iterator *)in_stack_ffffffffffffff20,
                         (directory_iterator *)in_stack_ffffffffffffff18);
      directory_iterator::~directory_iterator((directory_iterator *)0x1dc0a7);
      if (!bVar1) break;
      bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
      if ((bVar1) &&
         (bVar1 = detail::is_not_found_error((error_code *)in_stack_ffffffffffffff20), !bVar1)) {
        local_a4 = 2;
        goto LAB_001dc271;
      }
      directory_iterator::operator->((directory_iterator *)0x1dc0f7);
      bVar1 = directory_entry::is_symlink
                        (in_stack_ffffffffffffff28,(error_code *)in_stack_ffffffffffffff20);
      bVar2 = std::error_code::operator_cast_to_bool(in_RSI);
      if (bVar2) {
        local_8 = (error_code *)0xffffffffffffffff;
        local_a4 = 1;
        goto LAB_001dc271;
      }
      if (bVar1) {
LAB_001dc1df:
        bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
        if (!bVar1) {
          in_stack_ffffffffffffff20 = directory_iterator::operator->((directory_iterator *)0x1dc1fa)
          ;
          this = (filesystem *)directory_entry::path(in_stack_ffffffffffffff20);
          remove(this,(char *)in_RSI);
        }
        bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
        if (bVar1) {
          local_8 = (error_code *)0xffffffffffffffff;
          local_a4 = 1;
          goto LAB_001dc271;
        }
        ec_00 = (error_code *)((long)&ec_00->_M_value + 1);
      }
      else {
        directory_iterator::operator->((directory_iterator *)0x1dc157);
        bVar1 = directory_entry::is_directory(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        if (!bVar1) goto LAB_001dc1df;
        in_stack_ffffffffffffff28 = directory_iterator::operator->((directory_iterator *)0x1dc180);
        directory_entry::path(in_stack_ffffffffffffff28);
        uVar4 = remove_all((path *)in_RSI,ec_00);
        ec_00 = (error_code *)((long)&ec_00->_M_value + uVar4);
        bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
        if (bVar1) {
          local_8 = (error_code *)0xffffffffffffffff;
          local_a4 = 1;
          goto LAB_001dc271;
        }
      }
      directory_iterator::increment
                ((directory_iterator *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    }
    local_a4 = 2;
LAB_001dc271:
    directory_iterator::~directory_iterator((directory_iterator *)0x1dc27b);
    if (local_a4 != 2) goto LAB_001dc30f;
  }
  bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
  if ((!bVar1) && (uVar3 = remove(in_RDI,(char *)in_RSI), (uVar3 & 1) != 0)) {
    ec_00 = (error_code *)((long)&ec_00->_M_value + 1);
  }
  bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
  local_8 = ec_00;
  if (bVar1) {
    local_8 = (error_code *)0xffffffffffffffff;
  }
LAB_001dc30f:
  file_status::~file_status(local_68);
  return (uintmax_t)local_8;
}

Assistant:

GHC_INLINE uintmax_t remove_all(const path& p, std::error_code& ec) noexcept
{
    ec.clear();
    uintmax_t count = 0;
    if (p == "/") {
        ec = detail::make_error_code(detail::portable_error::not_supported);
        return static_cast<uintmax_t>(-1);
    }
    std::error_code tec;
    auto fs = symlink_status(p, tec);
    if (exists(fs) && is_directory(fs)) {
        for (auto iter = directory_iterator(p, ec); iter != directory_iterator(); iter.increment(ec)) {
            if (ec && !detail::is_not_found_error(ec)) {
                break;
            }
            bool is_symlink_result = iter->is_symlink(ec);
            if (ec)
                return static_cast<uintmax_t>(-1);
            if (!is_symlink_result && iter->is_directory(ec)) {
                count += remove_all(iter->path(), ec);
                if (ec) {
                    return static_cast<uintmax_t>(-1);
                }
            }
            else {
                if (!ec) {
                    remove(iter->path(), ec);
                }
                if (ec) {
                    return static_cast<uintmax_t>(-1);
                }
                ++count;
            }
        }
    }
    if (!ec) {
        if (remove(p, ec)) {
            ++count;
        }
    }
    if (ec) {
        return static_cast<uintmax_t>(-1);
    }
    return count;
}